

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::Disconnected::receive(Disconnected *this)

{
  char (*in_RCX) [23];
  PromiseNode *extraout_RDX;
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> PVar1;
  Array<char> AStack_188;
  Exception local_170;
  
  _::Debug::makeDescription<char_const(&)[23]>
            ((String *)&AStack_188,(Debug *)"\"WebSocket disconnected\"","WebSocket disconnected",
             in_RCX);
  Exception::Exception
            (&local_170,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xbce,(String *)&AStack_188);
  Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::Promise
            ((Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> *)this
             ,&local_170);
  Exception::~Exception(&local_170);
  Array<char>::~Array(&AStack_188);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>)
         PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<Message> receive() override {
      return KJ_EXCEPTION(DISCONNECTED, "WebSocket disconnected");
    }